

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_joinref.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::BindColumn(duckdb *this,Binder *binder,ClientContext *context,BindingAlias *alias,
                  string *column_name)

{
  pointer *__ptr;
  undefined1 local_98 [16];
  element_type *local_88;
  ExpressionBinder expr_binder;
  
  make_uniq_base<duckdb::ParsedExpression,duckdb::ColumnRefExpression,std::__cxx11::string_const&,duckdb::BindingAlias_const&>
            ((duckdb *)(local_98 + 8),column_name,alias);
  ExpressionBinder::ExpressionBinder(&expr_binder,binder,context,false);
  ExpressionBinder::Bind
            ((ExpressionBinder *)local_98,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&expr_binder,(LogicalType *)(local_98 + 8),false);
  make_uniq<duckdb::BoundExpression,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((duckdb *)&local_88,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             local_98);
  *(element_type **)this = local_88;
  if ((_Head_base<0UL,_duckdb::Expression_*,_false>)local_98._0_8_ !=
      (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
    (*((BaseExpression *)local_98._0_8_)->_vptr_BaseExpression[1])();
  }
  ExpressionBinder::~ExpressionBinder(&expr_binder);
  if ((long *)local_98._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_98._8_8_ + 8))();
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

static unique_ptr<ParsedExpression> BindColumn(Binder &binder, ClientContext &context, const BindingAlias &alias,
                                               const string &column_name) {
	auto expr = make_uniq_base<ParsedExpression, ColumnRefExpression>(column_name, alias);
	ExpressionBinder expr_binder(binder, context);
	auto result = expr_binder.Bind(expr);
	return make_uniq<BoundExpression>(std::move(result));
}